

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O2

void tcg_gen_xor_vec_ppc64
               (TCGContext_conflict10 *tcg_ctx,uint vece,TCGv_vec r,TCGv_vec a,TCGv_vec b)

{
  TCGv_vec in_R9;
  
  vec_gen_op3(tcg_ctx,INDEX_op_xor_vec,(uint)r,a,b,in_R9);
  return;
}

Assistant:

void tcg_gen_xor_vec(TCGContext *tcg_ctx, unsigned vece, TCGv_vec r, TCGv_vec a, TCGv_vec b)
{
    vec_gen_op3(tcg_ctx, INDEX_op_xor_vec, 0, r, a, b);
}